

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O0

void __thiscall cmXMLWriter::Attribute<bool>(cmXMLWriter *this,char *name,bool *value)

{
  bool bVar1;
  ostream *poVar2;
  bool *value_local;
  char *name_local;
  cmXMLWriter *this_local;
  
  PreAttribute(this);
  poVar2 = std::operator<<(this->Output,name);
  poVar2 = std::operator<<(poVar2,"=\"");
  bVar1 = SafeAttribute<bool>((bool)(*value & 1));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  std::operator<<(poVar2,'\"');
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }